

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

string * __thiscall
NavierStokesBase::thePlotFileType_abi_cxx11_(string *__return_storage_ptr__,NavierStokesBase *this)

{
  int iVar1;
  allocator local_9;
  
  if (thePlotFileType[abi:cxx11]()::the_plot_file_type_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&thePlotFileType[abi:cxx11]()::the_plot_file_type_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&thePlotFileType[abi:cxx11]()::the_plot_file_type_abi_cxx11_,
                 "NavierStokes-V1.1",&local_9);
      __cxa_atexit(std::__cxx11::string::~string,
                   &thePlotFileType[abi:cxx11]()::the_plot_file_type_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&thePlotFileType[abi:cxx11]()::the_plot_file_type_abi_cxx11_);
    }
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&thePlotFileType[abi:cxx11]()::the_plot_file_type_abi_cxx11_);
  return __return_storage_ptr__;
}

Assistant:

std::string
NavierStokesBase::thePlotFileType () const
{
    //
    // Increment this whenever the writePlotFile() format changes.
    //
    static const std::string the_plot_file_type("NavierStokes-V1.1");

    return the_plot_file_type;
}